

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O1

_format gl4cts::TextureViewUtilities::getFormatOfInternalformat(GLenum internalformat)

{
  _format _Var1;
  TestError *this;
  ulong uVar2;
  uint uVar3;
  
  _Var1 = FORMAT_UNORM;
  if ((int)internalformat < 0x8c3a) {
    if (0x8228 < (int)internalformat) {
      switch(internalformat) {
      case 0x8229:
      case 0x822a:
      case 0x822b:
      case 0x822c:
        goto switchD_00a2d92d_caseD_8c41;
      case 0x822d:
      case 0x822e:
      case 0x822f:
      case 0x8230:
        break;
      case 0x8231:
      case 0x8233:
      case 0x8235:
      case 0x8237:
      case 0x8239:
      case 0x823b:
        return FORMAT_SIGNED_INTEGER;
      case 0x8232:
      case 0x8234:
      case 0x8236:
      case 0x8238:
      case 0x823a:
      case 0x823c:
        return FORMAT_UNSIGNED_INTEGER;
      default:
        if ((7 < internalformat - 0x8814) || ((0xc3U >> (internalformat - 0x8814 & 0x1f) & 1) == 0))
        goto switchD_00a2d92d_caseD_8c3b;
      }
      goto switchD_00a2d92d_caseD_8c3a;
    }
    if ((internalformat - 0x8051 < 0xb) && ((0x5e9U >> (internalformat - 0x8051 & 0x1f) & 1) != 0))
    {
      return FORMAT_UNORM;
    }
    uVar3 = internalformat - 0x81a5;
LAB_00a2d9bc:
    if (1 < uVar3) {
switchD_00a2d92d_caseD_8c3b:
      this = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this,"Unrecognized internalformat",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                 ,0x364);
      __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    goto switchD_00a2d92d_caseD_8c3a;
  }
  if (0x8dba < (int)internalformat) {
    if (0x8f93 < (int)internalformat) {
      if (7 < internalformat - 0x8f94) {
        if (internalformat == 0x906f) {
          return FORMAT_UNSIGNED_INTEGER;
        }
        goto switchD_00a2d92d_caseD_8c3b;
      }
switchD_00a2d92d_caseD_8c41:
      return FORMAT_SNORM;
    }
    switch(internalformat) {
    case 0x8dbb:
    case 0x8dbd:
      return FORMAT_UNORM;
    case 0x8dbc:
    case 0x8dbe:
      goto switchD_00a2d92d_caseD_8c41;
    default:
      if (internalformat - 0x8e8c < 2) {
        return FORMAT_UNORM;
      }
      uVar3 = internalformat - 0x8e8e;
    }
    goto LAB_00a2d9bc;
  }
  uVar2 = (ulong)(internalformat - 0x8d62);
  if (internalformat - 0x8d62 < 0x2e) {
    if ((0xc30c000UL >> (uVar2 & 0x3f) & 1) != 0) {
      return FORMAT_UNSIGNED_INTEGER;
    }
    if ((0x30c300000000U >> (uVar2 & 0x3f) & 1) != 0) {
      return FORMAT_SIGNED_INTEGER;
    }
    if (uVar2 == 0) {
      return FORMAT_UNORM;
    }
  }
  switch(internalformat) {
  case 0x8c3b:
  case 0x8c3c:
  case 0x8c3e:
  case 0x8c3f:
  case 0x8c40:
  case 0x8c42:
    goto switchD_00a2d92d_caseD_8c3b;
  case 0x8c3d:
    _Var1 = FORMAT_RGBE;
    break;
  case 0x8c41:
  case 0x8c43:
    break;
  default:
    if (internalformat != 0x8cac) goto switchD_00a2d92d_caseD_8c3b;
  case 0x8c3a:
switchD_00a2d92d_caseD_8c3a:
    _Var1 = FORMAT_FLOAT;
  }
switchD_00a2d92d_caseD_8c41:
  return _Var1;
}

Assistant:

_format TextureViewUtilities::getFormatOfInternalformat(const glw::GLenum internalformat)
{
	_format result = FORMAT_UNDEFINED;

	switch (internalformat)
	{
	case GL_COMPRESSED_RG_RGTC2:
	case GL_COMPRESSED_RGBA_BPTC_UNORM:
	case GL_COMPRESSED_SRGB_ALPHA_BPTC_UNORM:
	case GL_COMPRESSED_RED_RGTC1:
	case GL_RGBA16:
	case GL_RGBA4:
	case GL_RGBA8:
	case GL_RGB10_A2:
	case GL_RGB16:
	case GL_RGB5_A1:
	case GL_RGB565:
	case GL_RGB8:
	case GL_RG16:
	case GL_RG8:
	case GL_R16:
	case GL_R8:
	case GL_SRGB8:
	case GL_SRGB8_ALPHA8:
	{
		result = FORMAT_UNORM;

		break;
	}

	case GL_COMPRESSED_SIGNED_RED_RGTC1:
	case GL_COMPRESSED_SIGNED_RG_RGTC2:
	case GL_RGBA16_SNORM:
	case GL_RGBA8_SNORM:
	case GL_RGB16_SNORM:
	case GL_RGB8_SNORM:
	case GL_RG16_SNORM:
	case GL_RG8_SNORM:
	case GL_R16_SNORM:
	case GL_R8_SNORM:
	{
		result = FORMAT_SNORM;

		break;
	}

	case GL_RGB10_A2UI:
	case GL_RGBA16UI:
	case GL_RGBA32UI:
	case GL_RGBA8UI:
	case GL_RGB16UI:
	case GL_RGB32UI:
	case GL_RGB8UI:
	case GL_RG16UI:
	case GL_RG32UI:
	case GL_RG8UI:
	case GL_R16UI:
	case GL_R32UI:
	case GL_R8UI:
	{
		result = FORMAT_UNSIGNED_INTEGER;

		break;
	}

	case GL_RGB9_E5:
	{
		result = FORMAT_RGBE;

		break;
	}

	case GL_COMPRESSED_RGB_BPTC_UNSIGNED_FLOAT:
	case GL_COMPRESSED_RGB_BPTC_SIGNED_FLOAT:
	case GL_DEPTH_COMPONENT16:
	case GL_DEPTH_COMPONENT24:
	case GL_DEPTH_COMPONENT32F:
	case GL_R11F_G11F_B10F:
	case GL_RGBA16F:
	case GL_RGBA32F:
	case GL_RGB16F:
	case GL_RGB32F:
	case GL_RG16F:
	case GL_RG32F:
	case GL_R16F:
	case GL_R32F:
	{
		result = FORMAT_FLOAT;

		break;
	}

	case GL_RGBA16I:
	case GL_RGBA32I:
	case GL_RGBA8I:
	case GL_RGB16I:
	case GL_RGB32I:
	case GL_RGB8I:
	case GL_RG16I:
	case GL_RG32I:
	case GL_RG8I:
	case GL_R16I:
	case GL_R32I:
	case GL_R8I:
	{
		result = FORMAT_SIGNED_INTEGER;

		break;
	}

	default:
	{
		TCU_FAIL("Unrecognized internalformat");
	}
	} /* switch (interalformat) */

	return result;
}